

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing-v2_6_31.c
# Opt level: O2

int can_fixup_bittiming_v2_6_31(net_device *dev,can_bittiming *bt,can_bittiming_const *btc)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  
  uVar8 = bt->sjw;
  if (bt->sjw == 0) {
    bt->sjw = 1;
    uVar8 = 1;
  }
  iVar6 = -0x22;
  if ((((uVar8 <= btc->sjw_max) && (uVar8 = bt->phase_seg1 + bt->prop_seg, btc->tseg1_min <= uVar8))
      && (uVar8 <= btc->tseg1_max)) &&
     ((uVar1 = bt->phase_seg2, btc->tseg2_min <= uVar1 && (uVar1 <= btc->tseg2_max)))) {
    uVar4 = (ulong)bt->tq * (ulong)(dev->priv).clock.freq;
    uVar2 = btc->brp_inc;
    if (1 < (ulong)uVar2) {
      uVar4 = uVar4 / uVar2;
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar4 + 499999999;
    uVar7 = 1;
    if (1 < uVar2) {
      uVar7 = uVar2;
    }
    uVar7 = SUB164(auVar3 / ZEXT816(1000000000),0) * uVar7;
    bt->brp = uVar7;
    iVar6 = -0x16;
    if ((btc->brp_min <= uVar7) && (uVar7 <= btc->brp_max)) {
      iVar5 = uVar8 + uVar1 + 1;
      iVar6 = 0;
      bt->bitrate = (dev->priv).clock.freq / (uVar7 * iVar5);
      bt->sample_point = (int)(uVar8 * 1000 + 1000) / iVar5;
    }
  }
  return iVar6;
}

Assistant:

static int can_fixup_bittiming(struct net_device *dev, struct can_bittiming *bt,
			       const struct can_bittiming_const *btc)
{
	struct can_priv *priv = netdev_priv(dev);
	int tseg1, alltseg;
	u64 brp64;

	tseg1 = bt->prop_seg + bt->phase_seg1;
	if (!bt->sjw)
		bt->sjw = 1;
	if (bt->sjw > btc->sjw_max ||
	    tseg1 < btc->tseg1_min || tseg1 > btc->tseg1_max ||
	    bt->phase_seg2 < btc->tseg2_min || bt->phase_seg2 > btc->tseg2_max)
		return -ERANGE;

	brp64 = (u64)priv->clock.freq * (u64)bt->tq;
	if (btc->brp_inc > 1)
		do_div(brp64, btc->brp_inc);
	brp64 += 500000000UL - 1;
	do_div(brp64, 1000000000UL); /* the practicable BRP */
	if (btc->brp_inc > 1)
		brp64 *= btc->brp_inc;
	bt->brp = (u32)brp64;

	if (bt->brp < btc->brp_min || bt->brp > btc->brp_max)
		return -EINVAL;

	alltseg = bt->prop_seg + bt->phase_seg1 + bt->phase_seg2 + 1;
	bt->bitrate = priv->clock.freq / (bt->brp * alltseg);
	bt->sample_point = ((tseg1 + 1) * 1000) / alltseg;

	return 0;
}